

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::AtHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  int iVar1;
  ThreadContext *threadContext;
  Var aValue;
  JavascriptLibrary *this;
  undefined4 extraout_var;
  double T1;
  Var element;
  ulong local_80;
  int64_t k;
  int64_t relativeIndex;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  uint length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_60,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,pArr);
  k = 0;
  if ((SUB84(args->Info,0) & 0xffffff) != 1 && ((ulong)args->Info & 0xffffff) != 0) {
    JsReentLock::unlock((JsReentLock *)local_60);
    aValue = Arguments::operator[](args,1);
    T1 = JavascriptConversion::ToInteger(aValue,(ScriptContext *)jsReentLock._24_8_);
    k = NumberUtilities::TryToInt64(T1);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    JsReentLock::relock((JsReentLock *)local_60);
  }
  local_80 = k;
  if (k < 0) {
    local_80 = (ulong)length + k;
  }
  if (((long)local_80 < 0) || ((long)(ulong)length <= (long)local_80)) {
    this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    pArr_local = (JavascriptArray *)
                 JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  }
  else if (typedArrayBase == (TypedArrayBase *)0x0) {
    JsReentLock::unlock((JsReentLock *)local_60);
    pArr_local = (JavascriptArray *)
                 Js::JavascriptOperators::GetItem
                           (obj,(uint32)local_80,(ScriptContext *)jsReentLock._24_8_);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    JsReentLock::relock((JsReentLock *)local_60);
  }
  else {
    iVar1 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,local_80 & 0xffffffff);
    pArr_local = (JavascriptArray *)CONCAT44(extraout_var,iVar1);
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_60);
  return pArr_local;
}

Assistant:

Var JavascriptArray::AtHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        // 3. Let relativeIndex be ? ToInteger(index).
        int64_t relativeIndex = 0;

        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, relativeIndex = NumberUtilities::TryToInt64(JavascriptConversion::ToInteger(args[1], scriptContext)));
        }

        // 4. If relativeIndex >= 0, then
        //     a. Let k be relativeIndex.
        // 5. Else,
        //     a. Let k be len + relativeIndex.
        int64_t k = relativeIndex;
        
        if (relativeIndex < 0)
        {
            k += (int64_t)length;
        }
        
        // 6. If k < 0 or k >= len, then return undefined.
        if (k < 0 || k >= (int64_t)length)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        
        
        if (typedArrayBase)
        {
            // %typedarray%.prototype.at(index): https://tc39.es/proposal-relative-indexing-method/#sec-array.prototype.at
            // 8. Return ? Get(O, ! ToString(k)).
            return typedArrayBase->DirectGetItem((uint32_t)k);
        }
        else
        {
            Var element;
            // 7. Return ? Get(O, ! ToString(k)).
            JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, (T)k, scriptContext));
            return element;
        }
    }